

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O1

textblock * object_info_ego(ego_item *ego)

{
  ulong uVar1;
  textblock *ptVar2;
  ulong uVar3;
  object obj;
  object known_obj;
  object local_2a8;
  object local_160;
  
  memcpy(&local_2a8,&DAT_002307a0,0x148);
  memcpy(&local_160,&DAT_002307a0,0x148);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if ((k_info[uVar3].name != (char *)0x0) && (uVar3 == ego->poss_items->kidx)) break;
    uVar1 = uVar3 + 1;
  } while (uVar3 + 1 < (ulong)z_info->k_max);
  local_2a8.kind = k_info + uVar3;
  local_2a8.tval = (uint8_t)(local_2a8.kind)->tval;
  local_2a8.sval = (uint8_t)(local_2a8.kind)->sval;
  local_2a8.ego = ego;
  ego_apply_magic(&local_2a8,L'\0',MINIMISE);
  object_copy(&local_160,&local_2a8);
  local_2a8.known = &local_160;
  ptVar2 = object_info_out(&local_2a8,L'\x04');
  object_wipe(&local_160);
  object_wipe(&local_2a8);
  return ptVar2;
}

Assistant:

textblock *object_info_ego(struct ego_item *ego)
{
	struct object_kind *kind = NULL;
	struct object obj = OBJECT_NULL, known_obj = OBJECT_NULL;
	size_t i;
	textblock *result;

	for (i = 0; i < z_info->k_max; i++) {
		kind = &k_info[i];
		if (!kind->name)
			continue;
		if (i == ego->poss_items->kidx)
			break;
	}

	obj.kind = kind;
	obj.tval = kind->tval;
	obj.sval = kind->sval;
	obj.ego = ego;
	ego_apply_magic(&obj, 0, MINIMISE);

	object_copy(&known_obj, &obj);
	obj.known = &known_obj;

	result = object_info_out(&obj, OINFO_NONE | OINFO_EGO);
	object_wipe(&known_obj);
	object_wipe(&obj);
	return result;
}